

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_shared_memory_size_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  ostream *poVar2;
  RenderContext *renderCtx;
  ProgramSources *sources;
  allocator<char> local_569;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  ShaderSource local_4e8;
  ProgramSources local_4c0;
  undefined1 local_3f0 [8];
  ShaderProgram program;
  undefined1 local_310 [8];
  ostringstream shaderBody;
  ostringstream shaderDecl;
  long numberOfElements;
  int limit;
  NegativeTestContext *ctx_local;
  
  iVar1 = getResourceLimit(ctx,0x8262);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
  poVar2 = std::operator<<((ostream *)&shaderBody.field_0x170,"shared uint values[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,((ulong)(long)iVar1 >> 2) + 1);
  poVar2 = std::operator<<(poVar2,"];\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(binding = 0) buffer Output {\n");
  poVar2 = std::operator<<(poVar2,"    uint values;\n");
  std::operator<<(poVar2,"} sb_out;\n");
  poVar2 = std::operator<<((ostream *)local_310,"    sb_out.values = values[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ulong)(long)iVar1 >> 2);
  std::operator<<(poVar2,"];\n");
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_4c0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateComputeShader(&local_508,ctx,&local_528,&local_548);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_4e8,&local_508);
  sources = glu::ProgramSources::operator<<(&local_4c0,&local_4e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3f0,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::~string((string *)&local_528);
  glu::ProgramSources::~ProgramSources(&local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHARED_MEMORY_SIZE.",
             &local_569);
  NegativeTestContext::beginSection(ctx,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  verifyLinkError(ctx,(ShaderProgram *)local_3f0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3f0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody.field_0x170);
  return;
}

Assistant:

void exceed_shared_memory_size_limit (NegativeTestContext& ctx)
{
	const int			limit				= getResourceLimit(ctx, GL_MAX_COMPUTE_SHARED_MEMORY_SIZE);
	const long			numberOfElements	= limit / sizeof(GLuint);
	std::ostringstream	shaderDecl;
	std::ostringstream	shaderBody;

	shaderDecl	<< "shared uint values[" << numberOfElements + 1 << "];\n"
				<< "\n"
				<< "layout(binding = 0) buffer Output {\n"
				<< "    uint values;\n"
				<< "} sb_out;\n";

	shaderBody	<< "    sb_out.values = values[" << numberOfElements << "];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHARED_MEMORY_SIZE.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}